

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cc
# Opt level: O0

void SIGINT_exit(int param_1)

{
  printf("\n");
  printf("c *** INTERRUPTED ***\n");
  if (0 < *(int *)(solver + 0x34)) {
    printStats((Solver *)0x10bdba);
    printf("c\n");
    printf("c *** INTERRUPTED ***\n");
  }
  _exit(1);
}

Assistant:

static void SIGINT_exit(int)
{
    printf("\n");
    printf("c *** INTERRUPTED ***\n");
    if (solver->verbosity > 0) {
        printStats(*solver);
        printf("c\n");
        printf("c *** INTERRUPTED ***\n");
    }
    _exit(1);
}